

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O3

void * HPDF_MemSet(void *s,HPDF_BYTE c,HPDF_UINT n)

{
  if (n != 0) {
    memset(s,(uint)c,(ulong)n);
    s = (void *)((long)s + (ulong)n);
  }
  return s;
}

Assistant:

void*
HPDF_MemSet  (void        *s,
              HPDF_BYTE    c,
              HPDF_UINT    n)
{
    HPDF_BYTE* b = (HPDF_BYTE*)s;

    while (n > 0) {
        *b = c;
        b++;
        n--;
    }

    return b;
}